

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

void kv_get_var_nentry_test(btree_kv_ops *kv_ops)

{
  __suseconds_t *__s1;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var1;
  int iVar2;
  bnode *__ptr;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  undefined8 auStack_c0 [13];
  undefined1 local_58 [8];
  timeval __test_begin;
  char local_32;
  char local_31 [7];
  uint8_t v_out;
  uint8_t v;
  
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  memleak_start();
  __ptr = dummy_node('\b','\x01',1);
  __ptr->nentry = 10;
  local_31[0] = 'd';
  pcVar3 = (char *)(auStack_c0 + 3);
  for (uVar6 = 0; uVar6 != 10; uVar6 = uVar6 + 1) {
    pcVar4 = pcVar3 + -0x10;
    auStack_c0[uVar6 + 3] = pcVar4;
    builtin_strncpy(pcVar3 + -0x18,"7 \x10",4);
    pcVar3[-0x14] = '\0';
    pcVar3[-0x13] = '\0';
    pcVar3[-0x12] = '\0';
    pcVar3[-0x11] = '\0';
    sprintf(pcVar4,"key%d",uVar6 & 0xffffffff);
    p_Var1 = kv_ops->set_kv;
    builtin_strncpy(pcVar3 + -0x18,"H \x10",4);
    pcVar3[-0x14] = '\0';
    pcVar3[-0x13] = '\0';
    pcVar3[-0x12] = '\0';
    pcVar3[-0x11] = '\0';
    (*p_Var1)(__ptr,(idx_t)uVar6,pcVar4,local_31);
    local_31[0] = local_31[0] + '\x01';
    pcVar3 = pcVar4;
  }
  local_31[0] = 'd';
  __s1 = &__test_begin.tv_usec;
  lVar5 = 0;
  do {
    if (lVar5 == 10) {
      builtin_strncpy(pcVar3 + -8,"7!\x10",4);
      pcVar3[-4] = '\0';
      pcVar3[-3] = '\0';
      pcVar3[-2] = '\0';
      pcVar3[-1] = '\0';
      free(__ptr);
      builtin_strncpy(pcVar3 + -8,"<!\x10",4);
      pcVar3[-4] = '\0';
      pcVar3[-3] = '\0';
      pcVar3[-2] = '\0';
      pcVar3[-1] = '\0';
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (kv_get_var_nentry_test(btree_kv_ops*)::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      builtin_strncpy(pcVar3 + -8,"m!\x10",4);
      pcVar3[-4] = '\0';
      pcVar3[-3] = '\0';
      pcVar3[-2] = '\0';
      pcVar3[-1] = '\0';
      fprintf(_stderr,pcVar4,"kv_get_var_nentry_test");
      return;
    }
    p_Var1 = kv_ops->get_kv;
    builtin_strncpy(pcVar3 + -8,"u \x10",4);
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    (*p_Var1)(__ptr,(idx_t)lVar5,__s1,&local_32);
    pcVar4 = (char *)auStack_c0[lVar5 + 3];
    pcVar3[-8] = -0x78;
    pcVar3[-7] = ' ';
    pcVar3[-6] = '\x10';
    pcVar3[-5] = '\0';
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    iVar2 = strcmp((char *)__s1,pcVar4);
    if (iVar2 != 0) {
      pcVar3[-8] = -0x3e;
      pcVar3[-7] = ' ';
      pcVar3[-6] = '\x10';
      pcVar3[-5] = '\0';
      pcVar3[-4] = '\0';
      pcVar3[-3] = '\0';
      pcVar3[-2] = '\0';
      pcVar3[-1] = '\0';
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0x13d);
      kv_get_var_nentry_test(btree_kv_ops*)::__test_pass = '\x01';
      pcVar3[-8] = -0x2c;
      pcVar3[-7] = ' ';
      pcVar3[-6] = '\x10';
      pcVar3[-5] = '\0';
      pcVar3[-4] = '\0';
      pcVar3[-3] = '\0';
      pcVar3[-2] = '\0';
      pcVar3[-1] = '\0';
      iVar2 = strcmp((char *)__s1,pcVar4);
      if (iVar2 != 0) {
        *(code **)(pcVar3 + -8) = kv_ins_var;
        __assert_fail("!(strcmp(k_out, key[idx]))",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x13d,"void kv_get_var_nentry_test(btree_kv_ops *)");
      }
    }
    if (local_32 != local_31[0]) {
      builtin_strncpy(pcVar3 + -8,"\x01!\x10",4);
      pcVar3[-4] = '\0';
      pcVar3[-3] = '\0';
      pcVar3[-2] = '\0';
      pcVar3[-1] = '\0';
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0x13e);
      kv_get_var_nentry_test(btree_kv_ops*)::__test_pass = '\x01';
      if (local_32 != local_31[0]) {
        builtin_strncpy(pcVar3 + -8,"/!\x10",4);
        pcVar3[-4] = '\0';
        pcVar3[-3] = '\0';
        pcVar3[-2] = '\0';
        pcVar3[-1] = '\0';
        __assert_fail("v_out == v",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x13e,"void kv_get_var_nentry_test(btree_kv_ops *)");
      }
    }
    local_31[0] = local_32 + '\x01';
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void kv_get_var_nentry_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t v, v_out;
    idx_t idx;
    int n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    char **key = alca(char*, n);
    char *k_out = alca(char, ksize);


    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;

    // set n keys
    for (idx = 0; idx < n; idx ++){
        key[idx] = alca(char, ksize);
        sprintf(key[idx], "key%d", idx);
        kv_ops->set_kv(node, idx, key[idx], (void *)&v);
        v++;
    }

    // get n keys
    v = 100;
    for (idx = 0; idx < n; idx ++){
        kv_ops->get_kv(node, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx])));
        TEST_CHK(v_out == v);
        v++;
    }

    free(node);
    memleak_end();
    TEST_RESULT("kv_get_var_nentry_test");
}